

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGUIElement.h
# Opt level: O2

bool __thiscall irr::gui::IGUIElement::sendToBack(IGUIElement *this,IGUIElement *child)

{
  list<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_> *this_00;
  IGUIElement *pIVar1;
  const_iterator __position;
  iterator iVar2;
  IGUIElement *local_28;
  
  pIVar1 = child->Parent;
  if ((pIVar1 == this) &&
     (__position._M_node = (child->ParentPos)._M_node,
     __position._M_node !=
     (this->Children).
     super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>._M_impl.
     _M_node.super__List_node_base._M_next)) {
    this_00 = &this->Children;
    local_28 = child;
    ::std::__cxx11::list<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>::erase
              (this_00,__position);
    iVar2 = ::std::__cxx11::list<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
            ::insert(this_00,(this_00->
                             super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
                             )._M_impl._M_node.super__List_node_base._M_next,&local_28);
    (local_28->ParentPos)._M_node = iVar2._M_node;
  }
  return pIVar1 == this;
}

Assistant:

virtual bool sendToBack(IGUIElement *child)
	{
		if (child->Parent != this)
			return false;
		if (child->ParentPos == Children.begin()) // already there
			return true;
		Children.erase(child->ParentPos);
		child->ParentPos = Children.insert(Children.begin(), child);
		return true;
	}